

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O0

void value_type_destroy(value v)

{
  type_id id_00;
  int iVar1;
  size_t sVar2;
  object poVar3;
  exception ex_00;
  long in_RDI;
  throwable th;
  exception ex;
  int delete_return;
  object o;
  klass c;
  function f_1;
  future f;
  value *v_map;
  size_t size_1;
  size_t index_1;
  value *v_array;
  size_t size;
  size_t index;
  type_id id;
  void *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  object in_stack_ffffffffffffff88;
  klass in_stack_ffffffffffffff90;
  ulong local_30;
  ulong local_18;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI != 0) {
    id_00 = value_type_id(in_stack_ffffffffffffff90);
    iVar1 = type_id_array(id_00);
    if (iVar1 == 0) {
      sVar2 = value_type_count(in_stack_ffffffffffffff78);
      value_to_array((value)0x10f61c);
      for (local_18 = 0; local_18 < sVar2; local_18 = local_18 + 1) {
        value_type_destroy((value)CONCAT44(id_00,in_stack_fffffffffffffff0));
      }
    }
    else {
      iVar1 = type_id_map(id_00);
      if (iVar1 == 0) {
        sVar2 = value_type_count(in_stack_ffffffffffffff78);
        value_to_map((value)0x10f68b);
        for (local_30 = 0; local_30 < sVar2; local_30 = local_30 + 1) {
          value_type_destroy((value)CONCAT44(id_00,in_stack_fffffffffffffff0));
        }
      }
      else {
        iVar1 = type_id_future(id_00);
        if (iVar1 == 0) {
          value_to_future((value)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          future_destroy((future_conflict)0x10f6f7);
        }
        else {
          iVar1 = type_id_function(id_00);
          if (iVar1 == 0) {
            value_to_function((value)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
            function_destroy((function_conflict)in_stack_ffffffffffffff90);
          }
          else {
            iVar1 = type_id_class(id_00);
            if (iVar1 == 0) {
              value_to_class((value)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
              class_destroy(in_stack_ffffffffffffff90);
            }
            else {
              iVar1 = type_id_object(id_00);
              if (iVar1 == 0) {
                poVar3 = value_to_object((value)CONCAT44(in_stack_ffffffffffffff84,
                                                         in_stack_ffffffffffffff80));
                iVar1 = object_delete(in_stack_ffffffffffffff88);
                if (iVar1 != 0) {
                  log_write_impl_va("metacall",0x2d6,"value_type_destroy",
                                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_value_type.c"
                                    ,3,
                                    "Invalid deletion of object <%p>, destructor return error code %d"
                                    ,poVar3);
                  in_stack_ffffffffffffff80 = iVar1;
                }
                object_destroy((object)in_stack_ffffffffffffff90);
              }
              else {
                iVar1 = type_id_exception(id_00);
                if (iVar1 == 0) {
                  ex_00 = value_to_exception((value)CONCAT44(in_stack_ffffffffffffff84,
                                                             in_stack_ffffffffffffff80));
                  exception_destroy(ex_00);
                }
                else {
                  iVar1 = type_id_throwable(id_00);
                  if (iVar1 == 0) {
                    value_to_throwable((value)CONCAT44(in_stack_ffffffffffffff84,
                                                       in_stack_ffffffffffffff80));
                    throwable_destroy((throwable)0x10f830);
                  }
                }
              }
            }
          }
        }
      }
    }
    iVar1 = type_id_invalid(id_00);
    if (iVar1 == 0) {
      log_write_impl_va("metacall",0x2f2,"value_type_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_value_type.c"
                        ,3,"Trying to destroy an invalid value <%p>",in_RDI);
    }
    else {
      value_destroy((value)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
  }
  return;
}

Assistant:

void value_type_destroy(value v)
{
	/* TODO: Disable logs here until log is completely thread safe and async signal safe */

	if (v != NULL)
	{
		type_id id = value_type_id(v);

		if (type_id_array(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value *v_array = value_to_array(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy array value <%p> of size %u", (void *)v, size); */

			for (index = 0; index < size; ++index)
			{
				value_type_destroy(v_array[index]);
			}
		}
		else if (type_id_map(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value *v_map = value_to_map(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy map value <%p> of size %u", (void *)v, size); */

			for (index = 0; index < size; ++index)
			{
				value_type_destroy(v_map[index]);
			}
		}
		else if (type_id_future(id) == 0)
		{
			future f = value_to_future(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy future value <%p>", (void *)v); */

			future_destroy(f);
		}
		else if (type_id_function(id) == 0)
		{
			function f = value_to_function(v);

			/*
			const char *name = function_name(f);

			if (name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous function <%p> value <%p>", (void *)f, (void *)v);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy function %s <%p> value <%p>", name, (void *)f, (void *)v);
			}
			*/

			function_destroy(f);
		}
		else if (type_id_class(id) == 0)
		{
			klass c = value_to_class(v);

			/*
			const char *name = class_name(c);

			if (name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous class <%p> value <%p>", (void *)c, (void *)v);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy class %s <%p> value <%p>", name, (void *)c, (void *)v);
			}
			*/

			class_destroy(c);
		}
		else if (type_id_object(id) == 0)
		{
			object o = value_to_object(v);
			int delete_return;

			/*
			const char *name = object_name(o);

			if (name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous object <%p> value <%p>", (void *)o, (void *)v);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy object %s <%p> value <%p>", name, (void *)o, (void *)v);
			}
			*/

			delete_return = object_delete(o);

			if (delete_return != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid deletion of object <%p>, destructor return error code %d", (void *)o, delete_return);
			}

			object_destroy(o);
		}
		else if (type_id_exception(id) == 0)
		{
			exception ex = value_to_exception(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy exception value <%p>", (void *)v); */

			exception_destroy(ex);
		}
		else if (type_id_throwable(id) == 0)
		{
			throwable th = value_to_throwable(v);

			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroy throwable value <%p> containing the value <%p>", (void *)v, (void *)throwable_value(th)); */

			throwable_destroy(th);
		}

		if (type_id_invalid(id) != 0)
		{
			value_destroy(v);
		}
		else
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trying to destroy an invalid value <%p>", (void *)v);
		}
	}
}